

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O3

void read_frequency(frequency_t *record,int field_count,char **field_names,char **field_values)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  time_exactness_t tVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  frequency_t *__dest;
  
  record->trip_id[0] = '\0';
  record->start_time[0] = '\0';
  record->end_time[0] = '\0';
  record->headway_secs = 0;
  record->exact_times = TE_NOT_EXACT;
  if (0 < field_count) {
    uVar6 = 0;
    do {
      pcVar7 = field_names[uVar6];
      iVar3 = strcmp(pcVar7,"trip_id");
      if (iVar3 == 0) {
        pcVar7 = field_values[uVar6];
        __dest = record;
LAB_00105f69:
        strcpy(__dest->trip_id,pcVar7);
      }
      else {
        iVar3 = strcmp(pcVar7,"start_time");
        if (iVar3 == 0) {
          pcVar7 = field_values[uVar6];
          __dest = (frequency_t *)record->start_time;
          goto LAB_00105f69;
        }
        iVar3 = strcmp(pcVar7,"end_time");
        if (iVar3 == 0) {
          pcVar7 = field_values[uVar6];
          __dest = (frequency_t *)record->end_time;
          goto LAB_00105f69;
        }
        iVar3 = strcmp(pcVar7,"headway_secs");
        if (iVar3 == 0) {
          lVar5 = strtol(field_values[uVar6],(char **)0x0,0);
          record->headway_secs = (int)lVar5;
        }
        else {
          iVar3 = strcmp(pcVar7,"exact_times");
          if (iVar3 == 0) {
            pbVar2 = (byte *)field_values[uVar6];
            bVar1 = *pbVar2;
            tVar4 = (time_exactness_t)bVar1;
            if (bVar1 != 0) {
              if (bVar1 == 0x31) {
                tVar4 = TE_NOT_SET - (pbVar2[1] == 0);
              }
              else if (bVar1 == 0x30) {
                tVar4 = (uint)(pbVar2[1] != 0) * 2;
              }
              else {
                tVar4 = TE_NOT_SET;
              }
            }
            record->exact_times = tVar4;
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while ((uint)field_count != uVar6);
  }
  return;
}

Assistant:

void read_frequency(frequency_t *record, int field_count, const char **field_names, const char **field_values) {
    init_frequency(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_time") == 0) {
            strcpy(record->start_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_time") == 0) {
            strcpy(record->end_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "headway_secs") == 0) {
            record->headway_secs = (int)strtol(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "exact_times") == 0) {
            record->exact_times = parse_time_exactness(field_values[i]);
            continue;
        }
    }
}